

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

bool s2textformat::MakeIndex
               (string_view str,
               unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_> *index)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  absl *this;
  reference pvVar5;
  pointer pMVar6;
  pointer __p;
  pointer __p_00;
  size_type sVar7;
  char cVar8;
  undefined8 in_R8;
  string_view piece;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  unique_ptr<S2Shape,_std::default_delete<S2Shape>_> local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> local_1e8;
  unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> lax_polygon;
  string_view *polygon_str;
  iterator __end1_2;
  iterator __begin1_2;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_1b0;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *local_198;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *__range1_2;
  undefined8 local_188;
  undefined8 uStack_180;
  unique_ptr<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_> local_178;
  unique_ptr<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_> lax_polyline;
  string_view *line_str;
  iterator __end1_1;
  iterator __begin1_1;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_148;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *local_130;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *__range1_1;
  unique_ptr<S2Shape,_std::default_delete<S2Shape>_> local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_100 [8];
  S2Point point;
  string_view *point_str;
  __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
  local_d8;
  iterator __end1;
  iterator __begin1;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_b0;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *local_98;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *__range1;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> points;
  S2LogMessage local_58;
  S2LogMessageVoidify local_41;
  undefined1 local_40 [8];
  vector<absl::string_view,_std::allocator<absl::string_view>_> strs;
  unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_> *index_local;
  string_view str_local;
  
  str_local.ptr_ = (char *)str.length_;
  index_local = (unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_> *)
                str.ptr_;
  strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)index;
  absl::StrSplit<absl::string_view>
            ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_40,
             (string_view *)&index_local,'#');
  sVar3 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::size
                    ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_40);
  if (sVar3 != 3) {
    sVar7 = 3;
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
               ,0x13a,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream(&local_58);
    poVar4 = std::operator<<(poVar4,"Check failed: (3) == (strs.size()) ");
    this = (absl *)std::operator<<(poVar4,"Must contain two # characters: ");
    points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)index_local;
    piece.length_ = sVar7;
    piece.ptr_ = str_local.ptr_;
    poVar4 = absl::operator<<(this,(ostream *)index_local,piece);
    S2LogMessageVoidify::operator&(&local_41,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1);
  pvVar5 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::operator[]
                     ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_40,0);
  str_00.length_ = 0x7c;
  str_00.ptr_ = (char *)pvVar5->length_;
  SplitString(&local_b0,(s2textformat *)pvVar5->ptr_,str_00,(char)in_R8);
  local_98 = &local_b0;
  __end1 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::begin(local_98);
  local_d8._M_current =
       (string_view *)
       std::vector<absl::string_view,_std::allocator<absl::string_view>_>::end(local_98);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&local_d8), bVar2) {
    point.c_[2] = (VType)__gnu_cxx::
                         __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
                         ::operator*(&__end1);
    Vector3<double>::Vector3((Vector3<double> *)local_100);
    local_118 = *(undefined8 *)point.c_[2];
    uStack_110 = *(undefined8 *)((long)point.c_[2] + 8);
    bVar2 = MakePoint(*(string_view *)point.c_[2],(S2Point *)local_100);
    if (!bVar2) {
      str_local.length_._7_1_ = 0;
      point_str._4_4_ = 1;
      goto LAB_00510228;
    }
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1,
               (value_type *)local_100);
    __gnu_cxx::
    __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
    ::operator++(&__end1);
  }
  point_str._4_4_ = 2;
LAB_00510228:
  std::vector<absl::string_view,_std::allocator<absl::string_view>_>::~vector(&local_b0);
  if (point_str._4_4_ == 2) {
    bVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::empty
                      ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1);
    if (!bVar2) {
      pMVar6 = std::unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>::
               operator->((unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
                           *)strs.
                             super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      absl::
      make_unique<S2PointVectorShape,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
                ((absl *)&__range1_1,
                 (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1);
      std::unique_ptr<S2Shape,std::default_delete<S2Shape>>::
      unique_ptr<S2PointVectorShape,std::default_delete<S2PointVectorShape>,void>
                ((unique_ptr<S2Shape,std::default_delete<S2Shape>> *)&local_120,
                 (unique_ptr<S2PointVectorShape,_std::default_delete<S2PointVectorShape>_> *)
                 &__range1_1);
      MutableS2ShapeIndex::Add(pMVar6,&local_120);
      std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::~unique_ptr(&local_120);
      std::unique_ptr<S2PointVectorShape,_std::default_delete<S2PointVectorShape>_>::~unique_ptr
                ((unique_ptr<S2PointVectorShape,_std::default_delete<S2PointVectorShape>_> *)
                 &__range1_1);
    }
    pvVar5 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::operator[]
                       ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_40,1)
    ;
    str_01.length_ = 0x7c;
    str_01.ptr_ = (char *)pvVar5->length_;
    SplitString(&local_148,(s2textformat *)pvVar5->ptr_,str_01,(char)in_R8);
    local_130 = &local_148;
    __end1_1 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::begin(local_130);
    line_str = (string_view *)
               std::vector<absl::string_view,_std::allocator<absl::string_view>_>::end(local_130);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
                          *)&line_str);
      cVar8 = (char)in_R8;
      if (!bVar2) break;
      lax_polyline._M_t.
      super___uniq_ptr_impl<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_>._M_t.
      super__Tuple_impl<0UL,_S2LaxPolylineShape_*,_std::default_delete<S2LaxPolylineShape>_>.
      super__Head_base<0UL,_S2LaxPolylineShape_*,_false>._M_head_impl =
           (__uniq_ptr_data<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>,_true,_true>
           )__gnu_cxx::
            __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
            ::operator*(&__end1_1);
      std::unique_ptr<S2LaxPolylineShape,std::default_delete<S2LaxPolylineShape>>::
      unique_ptr<std::default_delete<S2LaxPolylineShape>,void>
                ((unique_ptr<S2LaxPolylineShape,std::default_delete<S2LaxPolylineShape>> *)
                 &local_178);
      local_188 = *(undefined8 *)
                   lax_polyline._M_t.
                   super___uniq_ptr_impl<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_S2LaxPolylineShape_*,_std::default_delete<S2LaxPolylineShape>_>
                   .super__Head_base<0UL,_S2LaxPolylineShape_*,_false>._M_head_impl;
      uStack_180 = *(undefined8 *)
                    ((long)lax_polyline._M_t.
                           super___uniq_ptr_impl<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_S2LaxPolylineShape_*,_std::default_delete<S2LaxPolylineShape>_>
                           .super__Head_base<0UL,_S2LaxPolylineShape_*,_false>._M_head_impl + 8);
      bVar2 = MakeLaxPolyline(*(string_view *)
                               lax_polyline._M_t.
                               super___uniq_ptr_impl<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_S2LaxPolylineShape_*,_std::default_delete<S2LaxPolylineShape>_>
                               .super__Head_base<0UL,_S2LaxPolylineShape_*,_false>._M_head_impl,
                              &local_178);
      if (bVar2) {
        pMVar6 = std::unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>::
                 operator->((unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
                             *)strs.
                               super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __p = std::unique_ptr<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_>::release
                        (&local_178);
        std::unique_ptr<S2Shape,std::default_delete<S2Shape>>::
        unique_ptr<std::default_delete<S2Shape>,void>
                  ((unique_ptr<S2Shape,std::default_delete<S2Shape>> *)&__range1_2,
                   &__p->super_S2Shape);
        MutableS2ShapeIndex::Add
                  (pMVar6,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&__range1_2);
        std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::~unique_ptr
                  ((unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&__range1_2);
      }
      else {
        str_local.length_._7_1_ = 0;
      }
      cVar1 = !bVar2;
      std::unique_ptr<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_>::~unique_ptr
                (&local_178);
      cVar8 = (char)in_R8;
      if ((bool)cVar1) goto LAB_005104c6;
      __gnu_cxx::
      __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
      ::operator++(&__end1_1);
    }
    cVar1 = '\x04';
LAB_005104c6:
    std::vector<absl::string_view,_std::allocator<absl::string_view>_>::~vector(&local_148);
    if (cVar1 == '\x04') {
      pvVar5 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::operator[]
                         ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_40,
                          2);
      str_02.length_ = 0x7c;
      str_02.ptr_ = (char *)pvVar5->length_;
      SplitString(&local_1b0,(s2textformat *)pvVar5->ptr_,str_02,cVar8);
      local_198 = &local_1b0;
      __end1_2 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::begin
                           (local_198);
      polygon_str = (string_view *)
                    std::vector<absl::string_view,_std::allocator<absl::string_view>_>::end
                              (local_198);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
                                 *)&polygon_str), bVar2) {
        lax_polygon._M_t.
        super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>._M_t.
        super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
        super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl =
             (__uniq_ptr_data<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>,_true,_true>
             )__gnu_cxx::
              __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
              ::operator*(&__end1_2);
        std::unique_ptr<S2LaxPolygonShape,std::default_delete<S2LaxPolygonShape>>::
        unique_ptr<std::default_delete<S2LaxPolygonShape>,void>
                  ((unique_ptr<S2LaxPolygonShape,std::default_delete<S2LaxPolygonShape>> *)
                   &local_1e8);
        local_1f8 = *(undefined8 *)
                     lax_polygon._M_t.
                     super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>
                     .super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl;
        uStack_1f0 = *(undefined8 *)
                      ((long)lax_polygon._M_t.
                             super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>
                             .super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl + 8);
        bVar2 = MakeLaxPolygon(*(string_view *)
                                lax_polygon._M_t.
                                super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>
                                .super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl,
                               &local_1e8);
        if (bVar2) {
          pMVar6 = std::unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>::
                   operator->((unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
                               *)strs.
                                 super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __p_00 = std::unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>::
                   release(&local_1e8);
          std::unique_ptr<S2Shape,std::default_delete<S2Shape>>::
          unique_ptr<std::default_delete<S2Shape>,void>
                    ((unique_ptr<S2Shape,std::default_delete<S2Shape>> *)&local_200,
                     &__p_00->super_S2Shape);
          MutableS2ShapeIndex::Add(pMVar6,&local_200);
          std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::~unique_ptr(&local_200);
        }
        else {
          str_local.length_._7_1_ = 0;
        }
        cVar8 = !bVar2;
        std::unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>::~unique_ptr
                  (&local_1e8);
        if ((bool)cVar8) goto LAB_005106b6;
        __gnu_cxx::
        __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
        ::operator++(&__end1_2);
      }
      cVar8 = '\x06';
LAB_005106b6:
      std::vector<absl::string_view,_std::allocator<absl::string_view>_>::~vector(&local_1b0);
      if (cVar8 == '\x06') {
        str_local.length_._7_1_ = 1;
      }
    }
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1);
  std::vector<absl::string_view,_std::allocator<absl::string_view>_>::~vector
            ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_40);
  return (bool)(str_local.length_._7_1_ & 1);
}

Assistant:

bool MakeIndex(string_view str, std::unique_ptr<MutableS2ShapeIndex>* index) {
  vector<string_view> strs = absl::StrSplit(str, '#');
  S2_DCHECK_EQ(3, strs.size()) << "Must contain two # characters: " << str;

  vector<S2Point> points;
  for (const auto& point_str : SplitString(strs[0], '|')) {
    S2Point point;
    if (!MakePoint(point_str, &point)) return false;
    points.push_back(point);
  }
  if (!points.empty()) {
    (*index)->Add(make_unique<S2PointVectorShape>(std::move(points)));
  }
  for (const auto& line_str : SplitString(strs[1], '|')) {
    std::unique_ptr<S2LaxPolylineShape> lax_polyline;
    if (!MakeLaxPolyline(line_str, &lax_polyline)) return false;
    (*index)->Add(unique_ptr<S2Shape>(lax_polyline.release()));
  }
  for (const auto& polygon_str : SplitString(strs[2], '|')) {
    std::unique_ptr<S2LaxPolygonShape> lax_polygon;
    if (!MakeLaxPolygon(polygon_str, &lax_polygon)) return false;
    (*index)->Add(unique_ptr<S2Shape>(lax_polygon.release()));
  }
  return true;
}